

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrib.c
# Opt level: O0

void adjabil(int oldlevel,int newlevel)

{
  uint uVar1;
  uint uVar2;
  long prevabil;
  long mask;
  innate *rabil;
  innate *abil;
  int newlevel_local;
  int oldlevel_local;
  
  prevabil = 0x1000000;
  switch(urole.malenum) {
  case 0x159:
    rabil = arc_abil;
    break;
  case 0x15a:
    rabil = bar_abil;
    break;
  case 0x15b:
    rabil = cav_abil;
    break;
  default:
    rabil = (innate *)0x0;
    break;
  case 0x15d:
    rabil = con_abil;
    break;
  case 0x15e:
    rabil = hea_abil;
    break;
  case 0x15f:
    rabil = kni_abil;
    break;
  case 0x160:
    rabil = mon_abil;
    break;
  case 0x161:
    rabil = pri_abil;
    break;
  case 0x163:
    rabil = ran_abil;
    break;
  case 0x164:
    rabil = rog_abil;
    break;
  case 0x165:
    rabil = sam_abil;
    break;
  case 0x166:
    rabil = tou_abil;
    break;
  case 0x167:
    rabil = val_abil;
    break;
  case 0x168:
    rabil = wiz_abil;
  }
  if (urace.malenum != 0x2d) {
    if (urace.malenum == 0x4a) {
      mask = (long)orc_abil;
      goto LAB_0015edab;
    }
    if ((((urace.malenum != 0xaa) && (urace.malenum != 0xe8)) && (urace.malenum != 0x10b)) &&
       (urace.malenum == 0x111)) {
      mask = (long)elf_abil;
      goto LAB_0015edab;
    }
  }
  mask = 0;
LAB_0015edab:
  for (; rabil != (innate *)0x0 || mask != 0; rabil = rabil + 1) {
    if ((rabil == (innate *)0x0) || (rabil->ability == (uint *)0x0)) {
      if ((mask == 0) || (*(long *)(mask + 8) == 0)) break;
      rabil = (innate *)mask;
      mask = 0;
      prevabil = 0x2000000;
    }
    uVar1 = *rabil->ability;
    uVar2 = (uint)prevabil;
    if ((oldlevel < rabil->ulevel) && (rabil->ulevel <= newlevel)) {
      if (rabil->ulevel == '\x01') {
        *rabil->ability = *rabil->ability | uVar2 | 0x4000000;
      }
      else {
        *rabil->ability = *rabil->ability | uVar2;
      }
      if ((((ulong)(*rabil->ability & 0x7000000) & (prevabil ^ 0xffffffffffffffffU)) == 0) &&
         (*rabil->gainstr != '\0')) {
        pline("You feel %s!",rabil->gainstr);
      }
    }
    else if ((rabil->ulevel <= oldlevel) &&
            ((newlevel < rabil->ulevel &&
             (*rabil->ability = *rabil->ability & (uVar2 ^ 0xffffffff),
             (*rabil->ability & 0x7000000) == 0)))) {
      if (*rabil->losestr == '\0') {
        if (*rabil->gainstr != '\0') {
          pline("You feel less %s!",rabil->gainstr);
        }
      }
      else {
        pline("You feel %s!",rabil->losestr);
      }
    }
    if (uVar1 != *rabil->ability) {
      postadjabil(rabil->ability);
    }
  }
  if (0 < oldlevel) {
    if (oldlevel < newlevel) {
      add_weapon_skill(newlevel - oldlevel);
    }
    else {
      lose_weapon_skill(oldlevel - newlevel);
    }
  }
  return;
}

Assistant:

void adjabil(int oldlevel, int newlevel)
{
	const struct innate *abil, *rabil;
	long mask = FROMEXPER;


	switch (Role_switch) {
	case PM_ARCHEOLOGIST:   abil = arc_abil;	break;
	case PM_BARBARIAN:      abil = bar_abil;	break;
	case PM_CAVEMAN:        abil = cav_abil;	break;
	case PM_CONVICT:        abil = con_abil;	break;
	case PM_HEALER:         abil = hea_abil;	break;
	case PM_KNIGHT:         abil = kni_abil;	break;
	case PM_MONK:           abil = mon_abil;	break;
	case PM_PRIEST:         abil = pri_abil;	break;
	case PM_RANGER:         abil = ran_abil;	break;
	case PM_ROGUE:          abil = rog_abil;	break;
	case PM_SAMURAI:        abil = sam_abil;	break;
	case PM_TOURIST:        abil = tou_abil;	break;
	case PM_VALKYRIE:       abil = val_abil;	break;
	case PM_WIZARD:         abil = wiz_abil;	break;
	default:                abil = 0;		break;
	}

	switch (Race_switch) {
	case PM_ELF:            rabil = elf_abil;	break;
	case PM_ORC:            rabil = orc_abil;	break;
	case PM_HUMAN:
	case PM_DWARF:
	case PM_GNOME:
	case PM_VAMPIRE:
	default:                rabil = 0;		break;
	}

	while (abil || rabil) {
	    long prevabil;
	    /* Have we finished with the intrinsics list? */
	    if (!abil || !abil->ability) {
	    	/* Try the race intrinsics */
	    	if (!rabil || !rabil->ability) break;
	    	abil = rabil;
	    	rabil = 0;
	    	mask = FROMRACE;
	    }
		prevabil = *(abil->ability);
		if (oldlevel < abil->ulevel && newlevel >= abil->ulevel) {
			/* Abilities gained at level 1 can never be lost
			 * via level loss, only via means that remove _any_
			 * sort of ability.  A "gain" of such an ability from
			 * an outside source is devoid of meaning, so we set
			 * FROMOUTSIDE to avoid such gains.
			 */
			if (abil->ulevel == 1)
				*(abil->ability) |= (mask|FROMOUTSIDE);
			else
				*(abil->ability) |= mask;
			if (!(*(abil->ability) & INTRINSIC & ~mask)) {
			    if (*(abil->gainstr))
				pline("You feel %s!", abil->gainstr);
			}
		} else if (oldlevel >= abil->ulevel && newlevel < abil->ulevel) {
			*(abil->ability) &= ~mask;
			if (!(*(abil->ability) & INTRINSIC)) {
			    if (*(abil->losestr))
				pline("You feel %s!", abil->losestr);
			    else if (*(abil->gainstr))
				pline("You feel less %s!", abil->gainstr);
			}
		}
	    if (prevabil != *(abil->ability))	/* it changed */
		postadjabil(abil->ability);
	    abil++;
	}

	if (oldlevel > 0) {
	    if (newlevel > oldlevel)
		add_weapon_skill(newlevel - oldlevel);
	    else
		lose_weapon_skill(oldlevel - newlevel);
	}
}